

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint * Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  Kit_DsdObj_t KVar7;
  uint *puVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ushort uVar15;
  ushort uVar16;
  Kit_DsdObj_t *pKVar17;
  bool bVar18;
  uint *pTruthFans [16];
  uint *local_b8 [17];
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if (Id < (int)((uint)pNtk->nNodes + (uint)uVar1)) {
      if (Id < (int)(uint)uVar1) {
        pKVar17 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar17 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      if (p->vTtNodes->nSize <= Id) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar9 = (uint *)p->vTtNodes->pArray[(uint)Id];
      if (pKVar17 == (Kit_DsdObj_t *)0x0) {
        if ((int)(uint)uVar1 <= Id) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x23f,
                        "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                       );
        }
      }
      else {
        KVar7 = *pKVar17;
        uVar12 = (uint)KVar7 >> 6 & 7;
        if (uVar12 == 1) {
          if (0x3ffffff < (uint)KVar7) {
            __assert_fail("pObj->nFans == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x246,
                          "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                         );
          }
          uVar12 = 1 << ((char)uVar1 - 5U & 0x1f);
          if (uVar1 < 6) {
            uVar12 = 1;
          }
          if (0 < (int)uVar12) {
            puVar9 = (uint *)memset(puVar9,0xff,(ulong)uVar12 << 2);
            return puVar9;
          }
        }
        else if (uVar12 == 2) {
          if (((uint)KVar7 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x24e,
                          "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                         );
          }
          uVar1 = *(ushort *)(pKVar17 + 1);
          puVar8 = Kit_DsdTruthComputeNode_rec(p,pNtk,(uint)(uVar1 >> 1));
          uVar2 = pNtk->nVars;
          uVar13 = (ulong)(uint)(1 << ((char)uVar2 - 5U & 0x1f));
          if ((ushort)uVar2 < 6) {
            uVar13 = 1;
          }
          if ((uVar1 & 1) == 0) {
            if (0 < (int)uVar13) {
              lVar10 = uVar13 + 1;
              do {
                puVar9[lVar10 + -2] = puVar8[lVar10 + -2];
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
          }
          else if (0 < (int)uVar13) {
            lVar10 = uVar13 + 1;
            do {
              puVar9[lVar10 + -2] = ~puVar8[lVar10 + -2];
              lVar10 = lVar10 + -1;
            } while (1 < lVar10);
          }
        }
        else {
          KVar7 = *pKVar17;
          if (0x3ffffff < (uint)KVar7) {
            uVar13 = 0;
            do {
              puVar8 = Kit_DsdTruthComputeNode_rec
                                 (p,pNtk,(uint)(*(ushort *)
                                                 ((long)&pKVar17[1].field_0x0 + uVar13 * 2) >> 1));
              local_b8[uVar13] = puVar8;
              uVar13 = uVar13 + 1;
              KVar7 = *pKVar17;
            } while (uVar13 < (uint)KVar7 >> 0x1a);
          }
          uVar12 = (uint)KVar7 >> 6 & 7;
          if (uVar12 == 3) {
            uVar4 = pNtk->nVars;
            uVar12 = 1 << ((char)uVar4 - 5U & 0x1f);
            if ((ushort)uVar4 < 6) {
              uVar12 = 1;
            }
            if (0 < (int)uVar12) {
              memset(puVar9,0xff,(ulong)uVar12 * 4);
            }
            if (0x3ffffff < (uint)*pKVar17) {
              lVar10 = (ulong)uVar12 + 1;
              uVar13 = 0;
              do {
                puVar8 = local_b8[uVar13];
                if ((*(byte *)((long)&pKVar17[1].field_0x0 + uVar13 * 2) & 1) == 0) {
                  lVar14 = lVar10;
                  if (0 < (int)uVar12) {
                    do {
                      puVar9[lVar14 + -2] = puVar9[lVar14 + -2] & puVar8[lVar14 + -2];
                      lVar14 = lVar14 + -1;
                    } while (1 < lVar14);
                  }
                }
                else {
                  lVar14 = lVar10;
                  if (0 < (int)uVar12) {
                    do {
                      puVar9[lVar14 + -2] = puVar9[lVar14 + -2] & ~puVar8[lVar14 + -2];
                      lVar14 = lVar14 + -1;
                    } while (1 < lVar14);
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (uint)*pKVar17 >> 0x1a);
            }
          }
          else if (uVar12 == 4) {
            uVar3 = pNtk->nVars;
            uVar12 = 1 << ((char)uVar3 - 5U & 0x1f);
            if ((ushort)uVar3 < 6) {
              uVar12 = 1;
            }
            uVar13 = (ulong)uVar12;
            if (0 < (int)uVar12) {
              memset(puVar9,0,uVar13 * 4);
            }
            bVar18 = true;
            if (0x3ffffff < (uint)*pKVar17) {
              uVar11 = 0;
              uVar1 = 0;
              do {
                uVar16 = uVar1;
                uVar15 = *(ushort *)((long)&pKVar17[1].field_0x0 + uVar11 * 2);
                if (0 < (int)uVar12) {
                  puVar8 = local_b8[uVar11];
                  lVar10 = uVar13 + 1;
                  do {
                    puVar9[lVar10 + -2] = puVar9[lVar10 + -2] ^ puVar8[lVar10 + -2];
                    lVar10 = lVar10 + -1;
                  } while (1 < lVar10);
                }
                uVar15 = uVar15 & 1;
                uVar11 = uVar11 + 1;
                uVar1 = uVar16 ^ uVar15;
              } while (uVar11 < (uint)*pKVar17 >> 0x1a);
              bVar18 = uVar16 == uVar15;
            }
            if ((0 < (int)uVar12) && (!bVar18)) {
              lVar10 = uVar13 + 1;
              do {
                puVar9[lVar10 + -2] = ~puVar9[lVar10 + -2];
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
          }
          else {
            if (uVar12 != 5) {
              __assert_fail("pObj->Type == KIT_DSD_PRIME",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                            ,0x272,
                            "unsigned int *Kit_DsdTruthComputeNode_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int)"
                           );
            }
            KVar7 = *pKVar17;
            if ((uint)KVar7 < 0x4000000) {
              uVar12 = (uint)KVar7 >> 0x1a;
            }
            else {
              uVar13 = 0;
              do {
                if ((*(byte *)((long)&pKVar17[1].field_0x0 + uVar13 * 2) & 1) != 0) {
                  uVar5 = pNtk->nVars;
                  uVar12 = 1 << ((char)uVar5 - 5U & 0x1f);
                  if ((ushort)uVar5 < 6) {
                    uVar12 = 1;
                  }
                  if (0 < (int)uVar12) {
                    puVar8 = local_b8[uVar13];
                    lVar10 = (ulong)uVar12 + 1;
                    do {
                      puVar8[lVar10 + -2] = ~puVar8[lVar10 + -2];
                      lVar10 = lVar10 + -1;
                    } while (1 < lVar10);
                  }
                }
                uVar13 = uVar13 + 1;
                KVar7 = *pKVar17;
                uVar12 = (uint)KVar7 >> 0x1a;
              } while (uVar13 < uVar12);
            }
            puVar8 = (uint *)0x0;
            if (((uint)KVar7 & 0x1c0) == 0x140) {
              puVar8 = (uint *)((long)&pKVar17[1].field_0x0 + (ulong)((uint)KVar7 >> 8 & 0x3fc));
            }
            puVar8 = Kit_TruthCompose(p->dd,puVar8,uVar12,local_b8,(uint)pNtk->nVars,p->vTtBdds,
                                      p->vNodes);
            uVar6 = pNtk->nVars;
            uVar12 = 1 << ((char)uVar6 - 5U & 0x1f);
            if ((ushort)uVar6 < 6) {
              uVar12 = 1;
            }
            if (0 < (int)uVar12) {
              lVar10 = (ulong)uVar12 + 1;
              do {
                puVar9[lVar10 + -2] = puVar8[lVar10 + -2];
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
          }
        }
      }
      return puVar9;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned * Kit_DsdTruthComputeNode_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        pTruthFans[0] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        pTruthFans[i] = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(iLit) );
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            fCompl ^= Abc_LitIsCompl(iLit);
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}